

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Function FVar1;
  int i;
  int iVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  int row;
  int row_1;
  ulong *puVar6;
  long lVar7;
  EVP_PKEY_CTX *ctx_00;
  EVP_PKEY_CTX *__args;
  Vec3 sy;
  Vec3 sx;
  Vec4 s;
  float baseCoordTrans [16];
  float afStack_1e4 [53];
  undefined8 uStack_110;
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [2];
  long lStack_e0;
  undefined8 local_d8;
  long lStack_d0;
  undefined8 local_c8;
  long lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  undefined8 local_58;
  long lStack_50;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  long lStack_30;
  
  local_a8 = 0;
  uStack_a0 = 0;
  lVar3 = 0x4f;
  do {
    afStack_1e4[lVar3] =
         *(float *)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode.
                           _vptr_TestNode + lVar3 * 4) - *(float *)((long)this + lVar3 * 4 + -0x10);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x53);
  pfVar4 = &local_68;
  local_68 = (float)local_a8;
  fStack_64 = 0.0;
  uStack_60 = 0;
  fStack_5c = (this->m_lookupSpec).minCoord.m_data[0];
  lVar3 = 0;
  local_58 = local_a8 & 0xffffffff00000000;
  lStack_50 = (ulong)(uint)(this->m_lookupSpec).minCoord.m_data[1] << 0x20;
  local_48 = CONCAT44((float)uStack_a0 * -0.5,(float)uStack_a0 * 0.5);
  lStack_40 = (ulong)(uint)((this->m_lookupSpec).minCoord.m_data[2] + (float)uStack_a0 * 0.5) <<
              0x20;
  local_38 = CONCAT44(uStack_a0._4_4_ * 0.5,uStack_a0._4_4_ * -0.5);
  lStack_30 = (ulong)(uint)(uStack_a0._4_4_ * 0.5 + (this->m_lookupSpec).minCoord.m_data[3]) << 0x20
  ;
  pfVar5 = local_e8;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  lStack_c0 = 0;
  local_d8 = 0;
  lStack_d0 = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  lStack_e0 = 0;
  do {
    lVar7 = 0;
    do {
      pfVar5[lVar7] = *(float *)((long)pfVar4 + lVar7);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    lVar3 = lVar3 + 1;
    pfVar4 = pfVar4 + 4;
    pfVar5 = pfVar5 + 1;
  } while (lVar3 != 4);
  this_00 = &(this->super_ShaderRenderCase).m_userAttribTransforms;
  __args = (EVP_PKEY_CTX *)local_e8;
  uStack_110 = 0x111b632;
  ctx_00 = __args;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)__args);
  if (((this->m_lookupSpec).useBias & 1U) == 0) {
    FVar1 = (this->m_lookupSpec).function;
    if (FUNCTION_TEXELFETCH < FVar1) goto LAB_0111b6e6;
    if ((0x238U >> (FVar1 & 0x1f) & 1) != 0) goto LAB_0111b658;
    if ((0x1c0U >> (FVar1 & 0x1f) & 1) == 0) goto LAB_0111b6e6;
    local_f8[2] = 0.0;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    lVar3 = 0;
    do {
      local_f8[lVar3] =
           (this->m_lookupSpec).maxDX.m_data[lVar3] - (this->m_lookupSpec).minDX.m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_108[2] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    lVar3 = 0;
    do {
      local_108[lVar3] =
           (this->m_lookupSpec).maxDY.m_data[lVar3] - (this->m_lookupSpec).minDY.m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar5 = &local_68;
    local_68 = local_f8[0] * 0.5;
    fStack_64 = local_f8[0] * 0.5;
    lVar3 = 0;
    uStack_60 = 0;
    fStack_5c = (this->m_lookupSpec).minDX.m_data[0];
    local_58 = CONCAT44(local_f8[1] * 0.5,local_f8[1] * 0.5);
    lStack_50 = (ulong)(uint)(this->m_lookupSpec).minDX.m_data[1] << 0x20;
    local_48 = CONCAT44(local_f8[2] * 0.5,local_f8[2] * 0.5);
    lStack_40 = (ulong)(uint)(this->m_lookupSpec).minDX.m_data[2] << 0x20;
    local_38 = 0;
    lStack_30 = 0;
    local_e8[1] = local_108[0] * -0.5;
    local_e8[0] = local_108[0] * -0.5;
    lStack_e0 = (ulong)(uint)(this->m_lookupSpec).maxDY.m_data[0] << 0x20;
    local_d8 = CONCAT44(local_108[1] * -0.5,local_108[1] * -0.5);
    lStack_d0 = (ulong)(uint)(this->m_lookupSpec).maxDY.m_data[1] << 0x20;
    local_c8 = CONCAT44(local_108[2] * -0.5,local_108[2] * -0.5);
    lStack_c0 = (ulong)(uint)(this->m_lookupSpec).maxDY.m_data[2] << 0x20;
    local_b8 = 0;
    uStack_b0 = 0;
    puVar6 = &local_a8;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar6 + lVar7 * 4) = *(undefined4 *)((long)pfVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar5 = pfVar5 + 4;
      puVar6 = (ulong *)((long)puVar6 + 4);
    } while (lVar3 != 4);
    pfVar5 = (float *)&local_a8;
    uStack_110 = 0x111b8c8;
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)pfVar5);
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        pfVar5[lVar7] = *(float *)(__args + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x10);
      lVar3 = lVar3 + 1;
      __args = __args + 0x10;
      pfVar5 = pfVar5 + 1;
    } while (lVar3 != 4);
    ctx_00 = (EVP_PKEY_CTX *)&local_a8;
  }
  else {
LAB_0111b658:
    fStack_5c = (this->m_lookupSpec).minLodBias;
    pfVar4 = &local_68;
    uStack_60 = 0;
    local_38 = 0;
    lStack_30 = 0;
    local_48 = 0;
    lStack_40 = 0;
    local_58 = 0;
    lStack_50 = 0;
    local_68 = ((this->m_lookupSpec).maxLodBias - fStack_5c) * 0.5;
    fStack_64 = local_68;
    pfVar5 = local_e8;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    lStack_c0 = 0;
    local_d8 = 0;
    lStack_d0 = 0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    lStack_e0 = 0;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        pfVar5[lVar7] = *(float *)((long)pfVar4 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar4 = pfVar4 + 4;
      pfVar5 = pfVar5 + 1;
    } while (lVar3 != 4);
    ctx_00 = (EVP_PKEY_CTX *)local_e8;
  }
  uStack_110 = 0x111b6e6;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)ctx_00);
LAB_0111b6e6:
  uStack_110 = 0x111b6ee;
  initShaderSources(this);
  uStack_110 = 0x111b6f6;
  initTexture(this);
  uStack_110 = 0x111b6fe;
  iVar2 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}